

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O2

int ndn_lite_default_aes_cbc_encrypt
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t *output_size,
              uint8_t *aes_iv,abstract_aes_key *aes_key)

{
  uint8_t uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint8_t *in;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint uVar10;
  size_t __n;
  uint uVar11;
  uint8_t *out;
  uint uVar12;
  uint8_t auStack_110 [8];
  undefined1 local_108 [8];
  tc_aes_key_sched_struct schedule;
  
  schedule.words._168_8_ = local_108;
  if (aes_key->key_size < 0x10) {
    iVar4 = -0x1b;
  }
  else {
    lVar2 = -((ulong)(input_size + 0x10) + 0xf & 0xfffffffffffffff0);
    in = local_108 + lVar2;
    __n = (size_t)(input_size & 0xff);
    uVar12 = input_size & 0xf;
    if (uVar12 == 0) {
      puVar8 = auStack_110 + lVar2;
      puVar8[0] = 0x9a;
      puVar8[1] = '\x14';
      puVar8[2] = '\x11';
      puVar8[3] = '\0';
      puVar8[4] = '\0';
      puVar8[5] = '\0';
      puVar8[6] = '\0';
      puVar8[7] = '\0';
      memcpy(in,input_value,(ulong)(input_size & 0xf0));
    }
    else {
      puVar6 = auStack_110 + lVar2;
      puVar6[0] = '\x10';
      puVar6[1] = '\0';
      puVar6[2] = '\0';
      puVar6[3] = '\0';
      puVar6[4] = '\0';
      puVar6[5] = '\0';
      puVar6[6] = '\0';
      puVar6[7] = '\0';
      uVar11 = (int)*(undefined8 *)(auStack_110 + lVar2) - uVar12;
      uVar10 = uVar11 + (input_size & 0xff);
      if ((input_size + 0x10 & 0xff) < uVar10) {
        puVar7 = auStack_110 + lVar2;
        puVar7[0] = 0xf6;
        puVar7[1] = 0xff;
        puVar7[2] = 0xff;
        puVar7[3] = 0xff;
        puVar7[4] = 0xff;
        puVar7[5] = 0xff;
        puVar7[6] = 0xff;
        puVar7[7] = 0xff;
        return (int)*(undefined8 *)(auStack_110 + lVar2);
      }
      puVar9 = auStack_110 + lVar2;
      schedule.words._168_8_ = local_108;
      puVar9[0] = 0xbb;
      puVar9[1] = '\x14';
      puVar9[2] = '\x11';
      puVar9[3] = '\0';
      puVar9[4] = '\0';
      puVar9[5] = '\0';
      puVar9[6] = '\0';
      puVar9[7] = '\0';
      memcpy(in,input_value,__n);
      uVar1 = "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10"[(ulong)uVar12 ^ 0xf];
      for (uVar5 = 0; uVar11 != uVar5; uVar5 = uVar5 + 1) {
        in[uVar5 + __n] = uVar1;
      }
      __n = (size_t)uVar10;
    }
    uVar12 = (uint)__n;
    lVar3 = -(ulong)(uVar12 + 0x1f & 0xfffffff0);
    out = in + lVar3;
    builtin_memcpy(local_108 + lVar3 + lVar2 + -8,"\b\x15\x11",4);
    out[-4] = '\0';
    out[-3] = '\0';
    out[-2] = '\0';
    out[-1] = '\0';
    iVar4 = tc_aes128_set_encrypt_key((TCAesKeySched_t)local_108,aes_key->key_value);
    if (iVar4 == 1) {
      builtin_memcpy(local_108 + lVar3 + lVar2 + -8,"+\x15\x11",4);
      out[-4] = '\0';
      out[-3] = '\0';
      out[-2] = '\0';
      out[-1] = '\0';
      iVar4 = tc_cbc_mode_encrypt(out,uVar12 + 0x10,in,uVar12,aes_iv,(TCAesKeySched_t)local_108);
      if (iVar4 == 1) {
        builtin_memcpy(local_108 + lVar3 + lVar2 + -8,"C\x15\x11",4);
        out[-4] = '\0';
        out[-3] = '\0';
        out[-2] = '\0';
        out[-1] = '\0';
        memcpy(output_value,out + 0x10,__n);
        *output_size = uVar12;
        return 0;
      }
      out[-8] = 0xe7;
      out[-7] = 0xff;
      out[-6] = 0xff;
      out[-5] = 0xff;
      out[-4] = 0xff;
      out[-3] = 0xff;
      out[-2] = 0xff;
      out[-1] = 0xff;
    }
    else {
      out[-8] = 0xe4;
      out[-7] = 0xff;
      out[-6] = 0xff;
      out[-5] = 0xff;
      out[-4] = 0xff;
      out[-3] = 0xff;
      out[-2] = 0xff;
      out[-1] = 0xff;
    }
    iVar4 = (int)*(undefined8 *)(out + -8);
  }
  return iVar4;
}

Assistant:

int
ndn_lite_default_aes_cbc_encrypt(const uint8_t* input_value, uint32_t input_size,
                                 uint8_t* output_value, uint32_t* output_size,
                                 const uint8_t* aes_iv, const struct abstract_aes_key* aes_key)
{
  if (aes_key->key_size < NDN_SEC_AES_MIN_KEY_SIZE) {
    return NDN_SEC_WRONG_AES_SIZE;
  }
  // TODO: too much memory usage when encrypt large chunks
  uint8_t final_input[input_size + TC_AES_BLOCK_SIZE];
  int err_or_size = _pkcs7_padding(input_value, input_size, final_input, sizeof(final_input));
  if (err_or_size < 0)
    return err_or_size;
  uint8_t output[err_or_size + TC_AES_BLOCK_SIZE];
  struct tc_aes_key_sched_struct schedule;
  if (tc_aes128_set_encrypt_key(&schedule, aes_key->key_value) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_INIT_FAILURE;
  }
  // Tinycrypt will prepend IV to the output
  if (tc_cbc_mode_encrypt(output, err_or_size + TC_AES_BLOCK_SIZE,
                          final_input, err_or_size, aes_iv, &schedule) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  memcpy(output_value, output + TC_AES_BLOCK_SIZE, err_or_size);
  *output_size = err_or_size;
  return NDN_SUCCESS;
}